

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brake.cpp
# Opt level: O2

void __thiscall
ruckig::BrakeProfile::get_velocity_brake_trajectory
          (BrakeProfile *this,double a0,double aMax,double aMin,double jMax)

{
  double dVar1;
  
  (this->j)._M_elems[0] = 0.0;
  (this->j)._M_elems[1] = 0.0;
  (this->t)._M_elems[0] = 0.0;
  (this->t)._M_elems[1] = 0.0;
  if ((jMax == 0.0) && (!NAN(jMax))) {
    return;
  }
  if (a0 <= aMax) {
    if (aMin <= a0) {
      return;
    }
    (this->j)._M_elems[0] = jMax;
    dVar1 = 2.2e-14 - (a0 - aMin) / jMax;
  }
  else {
    (this->j)._M_elems[0] = -jMax;
    dVar1 = (a0 - aMax) / jMax + 2.2e-14;
  }
  (this->t)._M_elems[0] = dVar1;
  return;
}

Assistant:

void BrakeProfile::get_velocity_brake_trajectory(double a0, double aMax, double aMin, double jMax) {
    t[0] = 0.0;
    t[1] = 0.0;
    j[0] = 0.0;
    j[1] = 0.0;

    if (jMax == 0.0) {
        return; // Ignore braking for zero-limits
    }

    if (a0 > aMax) {
        j[0] = -jMax;
        t[0] = (a0 - aMax)/jMax + eps;

    } else if (a0 < aMin) {
        j[0] = jMax;
        t[0] = -(a0 - aMin)/jMax + eps;
    }
}